

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_preflight(int argc,char **argv,int unpack,fpstate *fpptr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  int local_454;
  int nfiles;
  int namelen;
  int iarg;
  char outfits [513];
  char acStack_23b [11];
  char infits [513];
  fpstate *fpptr_local;
  int unpack_local;
  char **argv_local;
  int argc_local;
  
  local_454 = 0;
  if (fpptr->initialized != 0x2a) {
    fp_msg("Error: internal initialization error\n");
    exit(-1);
  }
  nfiles = fpptr->firstfile;
  while( true ) {
    if (argc <= nfiles) {
      fpptr->preflight_checked = fpptr->preflight_checked + 1;
      return 0;
    }
    namelen._0_1_ = 0;
    sVar3 = strlen(argv[nfiles]);
    if (0x1fd < sVar3) {
      fp_msg("Error: input file name\n   ");
      fp_msg(argv[nfiles]);
      fp_msg("\n   is too long\n");
      fp_noop();
      exit(-1);
    }
    strncpy(acStack_23b + 3,argv[nfiles],0x201);
    if ((acStack_23b[3] == '-') && (acStack_23b[4] != '\0')) {
      fp_msg("Error: invalid input file name\n   ");
      fp_msg(argv[nfiles]);
      fp_msg("\n");
      fp_noop();
      exit(-1);
    }
    pcVar4 = strchr(acStack_23b + 3,0x5b);
    if ((pcVar4 != (char *)0x0) || (pcVar4 = strchr(acStack_23b + 3,0x5d), pcVar4 != (char *)0x0))
    break;
    if (unpack == 0) {
      if ((acStack_23b[3] != '-') && (iVar1 = fp_access(acStack_23b + 3), iVar1 != 0)) {
        sVar3 = strlen(acStack_23b + 3);
        if (0x200 < sVar3 + 3) {
          fp_msg("Error: input file name too long:\n ");
          fp_msg(acStack_23b + 3);
          fp_msg("\n ");
          fp_noop();
          exit(-1);
        }
        strcat(acStack_23b + 3,".gz");
        iVar1 = fp_access(acStack_23b + 3);
        if (iVar1 != 0) {
          sVar3 = strlen(acStack_23b + 3);
          acStack_23b[(long)((int)sVar3 + -3) + 3] = '\0';
          fp_msg("Error: can\'t find or read input file ");
          fp_msg(acStack_23b + 3);
          fp_msg("\n");
          fp_noop();
          exit(-1);
        }
      }
      sVar3 = strlen(acStack_23b + 3);
      if ((2 < (int)sVar3) && (iVar1 = strcmp(".fz",acStack_23b + (int)sVar3), iVar1 == 0)) {
        fp_msg("Error: fpack input file already has \'.fz\' suffix\n");
        fp_msg(acStack_23b + 3);
        fp_msg("\n");
        fp_noop();
        exit(-1);
      }
      if ((fpptr->to_stdout == 0) && (fpptr->test_all == 0)) {
        if (fpptr->outfile[0] == '\0') {
          if (acStack_23b[3] == '-') {
            strcpy((char *)&namelen,"input.fits");
          }
          else {
            strcpy((char *)&namelen,acStack_23b + 3);
          }
          sVar3 = strlen((char *)&namelen);
          iVar1 = (int)sVar3;
          if ((iVar1 < 3) ||
             (iVar2 = strcmp(".gz",(char *)((long)&nfiles + (long)iVar1 + 1)), iVar2 != 0)) {
            if ((3 < iVar1) &&
               (iVar2 = strcmp(".bz2",(char *)((long)&nfiles + (long)iVar1)), iVar2 == 0)) {
              *(undefined1 *)((long)&namelen + (long)(iVar1 + -4)) = 0;
            }
          }
          else {
            *(undefined1 *)((long)&namelen + (long)(iVar1 + -3)) = 0;
          }
          sVar3 = strlen((char *)&namelen);
          iVar1 = (int)sVar3;
          if ((3 < iVar1) &&
             (iVar2 = strcmp(".imh",(char *)((long)&nfiles + (long)iVar1)), iVar2 == 0)) {
            *(undefined1 *)((long)&namelen + (long)(iVar1 + -4)) = 0;
            sVar3 = strlen((char *)&namelen);
            if (sVar3 == 0x1fc) {
              strcat((char *)&namelen,".fit");
            }
            else {
              strcat((char *)&namelen,".fits");
            }
          }
          if (fpptr->clobber == 0) {
            sVar3 = strlen((char *)&namelen);
            if (0x1fd < sVar3) {
              fp_msg("Error: output file name too long:\n ");
              fp_msg((char *)&namelen);
              fp_msg("\n ");
              fp_noop();
              exit(-1);
            }
            strcat((char *)&namelen,".fz");
          }
          iVar1 = strcmp(acStack_23b + 3,(char *)&namelen);
          if ((iVar1 != 0) && (iVar1 = fp_access((char *)&namelen), iVar1 == 0)) {
            fp_msg("Error: output file already exists:\n ");
            fp_msg((char *)&namelen);
            fp_msg("\n ");
            fp_noop();
            exit(-1);
          }
        }
        else {
          local_454 = local_454 + 1;
          if (1 < local_454) {
            fp_msg("Error: cannot use same output file name for multiple files:\n   ");
            fp_msg(fpptr->outfile);
            fp_msg("\n");
            fp_noop();
            exit(-1);
          }
          iVar1 = fp_access(fpptr->outfile);
          if (iVar1 == 0) {
            fp_msg("Error: output file already exists:\n ");
            fp_msg(fpptr->outfile);
            fp_msg("\n ");
            fp_noop();
            exit(-1);
          }
        }
      }
    }
    else {
      if (acStack_23b[3] != '-') {
        iVar1 = fp_access(acStack_23b + 3);
        if (iVar1 == 0) {
          sVar3 = strlen(acStack_23b + 3);
          strcat(acStack_23b + 3,".fz");
          iVar1 = fp_access(acStack_23b + 3);
          if (iVar1 == 0) {
            acStack_23b[(long)(int)sVar3 + 3] = '\0';
            fp_msg("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
            fp_msg(acStack_23b + 3);
            fp_msg("\n  ");
            fp_msg(acStack_23b + 3);
            fp_msg(".fz\n");
            fp_noop();
            exit(-1);
          }
          acStack_23b[(long)(int)sVar3 + 3] = '\0';
        }
        else {
          strcat(acStack_23b + 3,".fz");
          iVar1 = fp_access(acStack_23b + 3);
          if (iVar1 != 0) {
            sVar3 = strlen(acStack_23b + 3);
            acStack_23b[(long)((int)sVar3 + -3) + 3] = '\0';
            fp_msg("Error: can\'t find or read input file ");
            fp_msg(acStack_23b + 3);
            fp_msg("\n");
            fp_noop();
            exit(-1);
          }
        }
      }
      if (fpptr->to_stdout == 0) {
        if (fpptr->outfile[0] == '\0') {
          if (fpptr->prefix[0] != '\0') {
            sVar3 = strlen(fpptr->prefix);
            sVar5 = strlen(acStack_23b + 3);
            if (0x200 < sVar3 + sVar5) {
              fp_msg("Error: output file name for\n   ");
              fp_msg(acStack_23b + 3);
              fp_msg("\n   is too long with the prefix\n");
              fp_noop();
              exit(-1);
            }
            strcpy((char *)&namelen,fpptr->prefix);
          }
          if (acStack_23b[3] == '-') {
            strcpy((char *)&namelen,"output.fits");
          }
          else {
            strcat((char *)&namelen,acStack_23b + 3);
          }
          sVar3 = strlen((char *)&namelen);
          iVar1 = (int)sVar3;
          if ((iVar1 < 3) ||
             (iVar2 = strcmp(".gz",(char *)((long)&nfiles + (long)iVar1 + 1)), iVar2 != 0)) {
            if ((3 < iVar1) &&
               (iVar2 = strcmp(".bz2",(char *)((long)&nfiles + (long)iVar1)), iVar2 == 0)) {
              *(undefined1 *)((long)&namelen + (long)(iVar1 + -4)) = 0;
            }
          }
          else {
            *(undefined1 *)((long)&namelen + (long)(iVar1 + -3)) = 0;
          }
          if (acStack_23b[3] != '-') {
            sVar3 = strlen((char *)&namelen);
            iVar1 = (int)sVar3;
            if ((iVar1 < 3) ||
               (iVar2 = strcmp(".fz",(char *)((long)&nfiles + (long)iVar1 + 1)), iVar2 != 0)) {
              if (fpptr->delete_suffix != 0) {
                fp_msg("Error: input compressed file ");
                fp_msg(acStack_23b + 3);
                fp_msg("\n does not have the default .fz suffix.\n");
                fp_noop();
                exit(-1);
              }
            }
            else {
              *(undefined1 *)((long)&namelen + (long)(iVar1 + -3)) = 0;
            }
          }
          iVar1 = strcmp(acStack_23b + 3,(char *)&namelen);
          if ((iVar1 != 0) && (iVar1 = fp_access((char *)&namelen), iVar1 == 0)) {
            fp_msg("Error: output file already exists:\n ");
            fp_msg((char *)&namelen);
            fp_msg("\n ");
            fp_noop();
            exit(-1);
          }
          if (fpptr->do_gzip_file != 0) {
            sVar3 = strlen((char *)&namelen);
            if (0x200 < sVar3 + 3) {
              fp_msg("Error: output file name too long:\n ");
              fp_msg((char *)&namelen);
              fp_msg("\n ");
              fp_noop();
              exit(-1);
            }
            strcat((char *)&namelen,".gz");
            iVar1 = fp_access((char *)&namelen);
            if (iVar1 == 0) {
              fp_msg("Error: output file already exists:\n ");
              fp_msg((char *)&namelen);
              fp_msg("\n ");
              fp_noop();
              exit(-1);
            }
            sVar3 = strlen((char *)&namelen);
            *(undefined1 *)((long)&namelen + (long)((int)sVar3 + -3)) = 0;
          }
        }
        else {
          local_454 = local_454 + 1;
          if (1 < local_454) {
            fp_msg("Error: cannot use same output file name for multiple files:\n   ");
            fp_msg(fpptr->outfile);
            fp_msg("\n");
            fp_noop();
            exit(-1);
          }
          iVar1 = fp_access(fpptr->outfile);
          if (iVar1 == 0) {
            fp_msg("Error: output file already exists:\n ");
            fp_msg(fpptr->outfile);
            fp_msg("\n ");
            fp_noop();
            exit(-1);
          }
        }
      }
    }
    nfiles = nfiles + 1;
  }
  fp_msg("Error: section/extension notation not supported: ");
  fp_msg(acStack_23b + 3);
  fp_msg("\n");
  fp_noop();
  exit(-1);
}

Assistant:

int fp_preflight (int argc, char *argv[], int unpack, fpstate *fpptr)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	int	iarg, namelen, nfiles = 0;

	if (fpptr->initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpptr->firstfile; iarg < argc; iarg++) {

            outfits[0] = '\0';
	    
            if (strlen(argv[iarg]) > SZ_STR - 4) {  /* allow for .fz or .gz suffix */
		    fp_msg ("Error: input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n   is too long\n"); fp_noop (); exit (-1);
	    }

	    strncpy (infits, argv[iarg], SZ_STR);
	    if (infits[0] == '-' && infits[1] != '\0') {  
	         /* don't interpret this as intending to read input file from stdin */
		    fp_msg ("Error: invalid input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); fp_noop (); exit (-1);
	    }
	    
            if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then check if */
		    strcat(infits, ".fz");       /* a .fz version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	         } else {   /* make sure a .fz version of the same file doesn't exist */
                    namelen = strlen(infits);
		    strcat(infits, ".fz");   
	            if (fp_access (infits) == 0) {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
		        fp_msg (infits); fp_msg ("\n  "); 
		        fp_msg (infits); fp_msg (".fz\n"); 
		        fp_noop (); exit (-1);
                    } else {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		    }
	         }
	      }

              /* if writing to stdout, then we are all done */
	      if (fpptr->to_stdout) {
                      continue;
	      }

              if (fpptr->outfile[0]) {  /* user specified output file name */
	          nfiles++;
		  if (nfiles > 1) {
		      fp_msg ("Error: cannot use same output file name for multiple files:\n   ");
		      fp_msg (fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
	          }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
	      }     

	      /* construct output file name to test */
	      if (fpptr->prefix[0]) {
                  if (strlen(fpptr->prefix) + strlen(infits) > SZ_STR - 1) {
		      fp_msg ("Error: output file name for\n   "); fp_msg (infits);
		      fp_msg ("\n   is too long with the prefix\n"); fp_noop (); exit (-1);
	          }
	          strcpy(outfits,fpptr->prefix);
	      }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "output.fits");
	      } else {
	        strcat(outfits, infits);
	      }

	      /* remove .gz or .bz2 suffix, if present (output is not gzipped) */
              namelen = strlen(outfits);
	      if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }

	      /* check for .fz suffix that is sometimes required */
	      /* and remove it if present */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
                 namelen = strlen(outfits);
	         if (namelen>=3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	         } else if (fpptr->delete_suffix) {  /* required suffix is missing */
		    fp_msg ("Error: input compressed file "); fp_msg (infits);
		    fp_msg ("\n does not have the default .fz suffix.\n"); 
		    fp_noop (); exit (-1);
	         }
	      }

	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }

	      /* if gzipping the output, make sure .gz file doesn't exist */
	      if (fpptr->do_gzip_file) {
                        if (strlen(outfits)+3 > SZ_STR-1)
                        {
		            fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
                        }
	                strcat(outfits, ".gz");
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
              		namelen = strlen(outfits);
                        outfits[namelen - 3] = '\0';  /* remove the .gz suffix again */
	      }
	  } else {
	  	/* ********** This section applies to fpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	        if (fp_access (infits) != 0) {  /* if not, then check if */
                    if (strlen(infits)+3 > SZ_STR-1)
                    {
		        fp_msg ("Error: input file name too long:\n "); fp_msg (infits);
		        fp_msg ("\n "); fp_noop (); exit (-1);
                    }
		    strcat(infits, ".gz");     /* a gzipped version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .gz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	        }
	      }

              /* make sure the file to pack does not already have a .fz suffix */
              namelen = strlen(infits);
	      if (namelen>=3 && !strcmp(".fz", infits + namelen - 3) ) {
		        fp_msg ("Error: fpack input file already has '.fz' suffix\n" ); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	      }

              /* if writing to stdout, or just testing the files, then we are all done */
	      if (fpptr->to_stdout || fpptr->test_all) {
                        continue;
	      }
              
              if (fpptr->outfile[0]) { /* user specified output file name */
                  nfiles++;
                  if (nfiles > 1) {
                      fp_msg("Error: cannot use same output file name for multiple files:\n   ");
                      fp_msg(fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
                  }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
              }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "input.fits");
	      } else {
	        strcpy(outfits, infits);
	      }

	      /* remove .gz suffix, if present (output is not gzipped) */
              /* do the same if compression suffix is bz2 */
              namelen = strlen(outfits);
	      if (namelen >=3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }
              
	      
	      /* remove .imh suffix (IRAF format image), and replace with .fits */
              namelen = strlen(outfits);
	      if (namelen >=4 && !strcmp(".imh", outfits + namelen - 4) ) {
                        outfits[namelen - 4] = '\0';
                        if (strlen(outfits) == SZ_STR-5)
                           strcat(outfits, ".fit");
                        else
                           strcat(outfits, ".fits");
	      }

	      /* If not clobbering the input file, add .fz suffix to output name */
	      if (! fpptr->clobber)
              {
                 if (strlen(outfits) > SZ_STR-4)
                 {
		    fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		    fp_msg ("\n "); fp_noop (); exit (-1);
                 }
                 else
		     strcat(outfits, ".fz");
              }
			
	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }
	  }   /* end of fpack section */
	}

	fpptr->preflight_checked++;
	return(0);
}